

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O3

void __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::increase
          (summary_impl<unsigned_int,_6UL> *this,data_t *arr,uint16_t pos)

{
  uint uVar1;
  atomic<unsigned_int> *paVar2;
  uint uVar3;
  uint uVar4;
  undefined6 in_register_00000012;
  long lVar5;
  ulong uVar6;
  ulong index;
  
  uVar6 = CONCAT62(in_register_00000012,pos) & 0xffffffff;
  paVar2 = data_t::operator[](arr,uVar6);
  LOCK();
  uVar3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
  (paVar2->super___atomic_base<unsigned_int>)._M_i =
       (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (4290000000 < uVar3) {
    paVar2 = data_t::operator[](arr,uVar6);
    LOCK();
    (paVar2->super___atomic_base<unsigned_int>)._M_i =
         (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    uVar1 = (uint)(pos >= 0x2000) * 0x2000 + 0x2000;
    uVar6 = (ulong)pos;
    uVar3 = uVar1 - pos;
    uVar4 = ((uint)(pos < 0x2000) * 0x2000 + (uint)pos) - 0x1fff;
    if ((int)uVar3 <= (int)uVar4) {
      uVar3 = uVar4;
    }
    if (1 < (int)uVar3) {
      lVar5 = (ulong)uVar3 - 1;
      index = uVar6;
      do {
        index = index - 1;
        uVar6 = uVar6 + 1;
        if (uVar6 < uVar1) {
          paVar2 = data_t::operator[](arr,uVar6);
          LOCK();
          uVar3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
          UNLOCK();
          if (uVar3 < 0xffb43481) {
            return;
          }
          paVar2 = data_t::operator[](arr,uVar6);
          LOCK();
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
        }
        if ((long)((ulong)(0x1fff < pos) * 0x2000) <= (long)index) {
          paVar2 = data_t::operator[](arr,index);
          LOCK();
          uVar3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
          UNLOCK();
          if (uVar3 < 0xffb43481) {
            return;
          }
          paVar2 = data_t::operator[](arr,index);
          LOCK();
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
        }
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  return;
}

Assistant:

void increase(data_t& arr, uint16_t pos) {
    auto res = arr[pos].fetch_add(1, std::memory_order::relaxed);
    if constexpr (std::is_same_v<uint_type, uint32_t>) {
      if (res > near_uint32_max) /*no overflow*/ [[likely]] {
        arr[pos].fetch_sub(1, std::memory_order::relaxed);
        int upper = (pos < bucket_size / 2) ? (bucket_size / 2) : (bucket_size);
        int lower = (pos < bucket_size / 2) ? (0) : (bucket_size / 2);
        for (int delta = 1, lim = (std::max)(upper - pos, pos - lower + 1);
             delta < lim; ++delta) {
          if (pos + delta < upper) {
            if (arr[pos + delta].fetch_add(1, std::memory_order::relaxed) <=
                near_uint32_max) {
              break;
            }
            arr[pos + delta].fetch_sub(1, std::memory_order::relaxed);
          }
          if (pos - delta >= lower) {
            if (arr[pos - delta].fetch_add(1, std::memory_order::relaxed) <=
                near_uint32_max) {
              break;
            }
            arr[pos - delta].fetch_sub(1, std::memory_order::relaxed);
          }
        }
      }
    }
  }